

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptGenerator.cpp
# Opt level: O3

void __thiscall
Js::JavascriptGenerator::JavascriptGenerator
          (JavascriptGenerator *this,DynamicType *type,Arguments *args,
          ScriptFunction *scriptFunction)

{
  DynamicObject::DynamicObject(&this->super_DynamicObject,type,true);
  (this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_014fb2e8;
  (this->frame).ptr = (InterpreterStackFrame *)0x0;
  this->state = SuspendedStart;
  (this->args).Info = args->Info;
  (this->args).Values = args->Values;
  Memory::Recycler::WBSetBit((char *)&this->scriptFunction);
  (this->scriptFunction).ptr = scriptFunction;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->scriptFunction);
  this->bailInSymbolsTraceArrayCount = 0;
  (this->resumeYieldObject).ptr = (DynamicObject *)0x0;
  (this->bailInSymbolsTraceArray).ptr = (BailInSymbol *)0x0;
  return;
}

Assistant:

JavascriptGenerator::JavascriptGenerator(
    DynamicType* type,
    Arguments& args,
    ScriptFunction* scriptFunction) :
        DynamicObject(type),
        args(args),
        frame(nullptr),
        state(GeneratorState::SuspendedStart),
        scriptFunction(scriptFunction),
        resumeYieldObject(nullptr) {}